

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_6.h
# Opt level: O0

string * convertNumberToString(string *__return_storage_ptr__,string *input)

{
  bool bVar1;
  int iVar2;
  reference pvVar3;
  invalid_argument *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  char *local_40;
  char *c;
  const_iterator __end1;
  const_iterator __begin1;
  string *__range1;
  int dotPosition;
  string *input_local;
  string *result;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  __end1._M_current = (char *)std::__cxx11::string::begin();
  c = (char *)std::__cxx11::string::end();
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&c);
    if (!bVar1) {
      return __return_storage_ptr__;
    }
    local_40 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&__end1);
    iVar2 = isdigit((int)*local_40);
    if (iVar2 == 0) {
      if (*local_40 != '.') {
        this = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::operator+(&local_70,input," is not a valid number!");
        std::invalid_argument::invalid_argument(this,(string *)&local_70);
        __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
      }
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::at(&spelledDigits_abi_cxx11_,10);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)pvVar3);
    }
    else {
      pvVar3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::at(&spelledDigits_abi_cxx11_,(long)(*local_40 + -0x30));
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)pvVar3);
    }
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,' ');
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

std::string convertNumberToString(const std::string& input)
{
	std::string result{};
	constexpr auto dotPosition = 10;
	for (auto&& c : input)
	{
		if (std::isdigit(c))
			result += spelledDigits.at(c - '0');
		else if (c == '.')
			result += spelledDigits.at(dotPosition);
		else
			throw std::invalid_argument(input + " is not a valid number!");
		result += ' ';
	}
	return result;
}